

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O0

StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::operator>>(StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                   *val)

{
  undefined1 uVar1;
  undefined1 uVar2;
  istream *piVar3;
  undefined8 in_RSI;
  StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RDI;
  string lexeme;
  cpp_dec_float<100U,_int,_void> *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 local_a4 [92];
  string local_48 [32];
  undefined8 local_28;
  StreamReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *local_18;
  undefined1 *local_10;
  undefined8 local_8;
  
  local_28 = in_RSI;
  std::__cxx11::string::string(local_48);
  do {
    piVar3 = std::operator>>(in_RDI->inp,local_48);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!(bool)uVar1) {
      (in_RDI->
      super_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ).finished = true;
      goto LAB_0011df6a;
    }
    std::__cxx11::string::c_str();
    uVar2 = IsInteger((char *)in_stack_ffffffffffffff38);
  } while (!(bool)uVar2);
  std::__cxx11::string::c_str();
  ReadInteger<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ((char *)in_stack_ffffffffffffff38);
  local_8 = local_28;
  local_10 = local_a4;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            ((cpp_dec_float<100U,_int,_void> *)
             CONCAT17(uVar1,CONCAT16(uVar2,in_stack_ffffffffffffff40)),in_stack_ffffffffffffff38);
LAB_0011df6a:
  local_18 = in_RDI;
  std::__cxx11::string::~string(local_48);
  return local_18;
}

Assistant:

StreamReader &operator>>(ValueType &val) override {
        std::string lexeme;
        while (inp >> lexeme) {
            if (!IsInteger(lexeme.c_str())) {
                continue;
            }
            val = ReadInteger<ValueType>(lexeme.c_str());
            return *this;
        }
        this->finished = true;
        return *this;
    }